

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

ExceptionOr<kj::Promise<kj::Maybe<kj::AutoCloseFd>_>_> * __thiscall
kj::_::ExceptionOr<kj::Promise<kj::Maybe<kj::AutoCloseFd>_>_>::operator=
          (ExceptionOr<kj::Promise<kj::Maybe<kj::AutoCloseFd>_>_> *this,
          ExceptionOr<kj::Promise<kj::Maybe<kj::AutoCloseFd>_>_> *param_1)

{
  PromiseNode *pPVar1;
  Disposer *pDVar2;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      pPVar1 = (this->value).ptr.field_1.value.super_PromiseBase.node.ptr;
      if (pPVar1 != (PromiseNode *)0x0) {
        (this->value).ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        pDVar2 = (this->value).ptr.field_1.value.super_PromiseBase.node.disposer;
        (**pDVar2->_vptr_Disposer)
                  (pDVar2,(_func_int *)
                          ((long)&pPVar1->_vptr_PromiseNode + (long)pPVar1->_vptr_PromiseNode[-2]));
      }
    }
    if ((param_1->value).ptr.isSet == true) {
      (this->value).ptr.field_1.value.super_PromiseBase.node.disposer =
           (param_1->value).ptr.field_1.value.super_PromiseBase.node.disposer;
      (this->value).ptr.field_1.value.super_PromiseBase.node.ptr =
           (param_1->value).ptr.field_1.value.super_PromiseBase.node.ptr;
      (param_1->value).ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (this->value).ptr.isSet = true;
    }
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;